

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int64_t HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                      int64_t threshold)

{
  HistogramPair *pHVar1;
  uint64_t uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  HistogramPair tmp;
  HistogramPair pair;
  HistogramPair local_20;
  
  if (histo_queue->size != histo_queue->max_size) {
    local_20.idx2 = idx2;
    if (idx2 < idx1) {
      local_20.idx2 = idx1;
    }
    if (idx1 < idx2) {
      idx2 = idx1;
    }
    local_20.idx1 = idx2;
    iVar7 = HistoQueueUpdatePair(histograms[idx2],histograms[local_20.idx2],threshold,&local_20);
    if (iVar7 == 0) {
      local_20.cost_diff = 0;
    }
    else {
      pHVar1 = histo_queue->queue;
      iVar7 = histo_queue->size;
      histo_queue->size = iVar7 + 1;
      pHVar1[iVar7].cost_combo = local_20.cost_combo;
      pHVar1 = pHVar1 + iVar7;
      pHVar1->idx1 = local_20.idx1;
      pHVar1->idx2 = local_20.idx2;
      pHVar1->cost_diff = local_20.cost_diff;
      pHVar1 = histo_queue->queue;
      lVar8 = (long)histo_queue->size;
      if (pHVar1[lVar8 + -1].cost_diff < pHVar1->cost_diff) {
        uVar2 = pHVar1->cost_combo;
        iVar5 = pHVar1->idx1;
        iVar6 = pHVar1->idx2;
        iVar3 = pHVar1->cost_diff;
        pHVar1->cost_combo = pHVar1[lVar8 + -1].cost_combo;
        iVar7 = pHVar1[lVar8 + -1].idx2;
        iVar4 = pHVar1[lVar8 + -1].cost_diff;
        pHVar1->idx1 = pHVar1[lVar8 + -1].idx1;
        pHVar1->idx2 = iVar7;
        pHVar1->cost_diff = iVar4;
        pHVar1[lVar8 + -1].cost_combo = uVar2;
        pHVar1[lVar8 + -1].idx1 = iVar5;
        pHVar1[lVar8 + -1].idx2 = iVar6;
        pHVar1[lVar8 + -1].cost_diff = iVar3;
      }
    }
    return local_20.cost_diff;
  }
  return 0;
}

Assistant:

static int64_t HistoQueuePush(HistoQueue* const histo_queue,
                              VP8LHistogram** const histograms, int idx1,
                              int idx2, int64_t threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0;
  assert(threshold <= 0);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  // Do not even consider the pair if it does not improve the entropy.
  if (!HistoQueueUpdatePair(h1, h2, threshold, &pair)) return 0;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}